

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_min.hpp
# Opt level: O2

__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
 burst::
 select_min<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>>*,std::vector<boost::iterator_range<std::_List_const_iterator<char>>,std::allocator<boost::iterator_range<std::_List_const_iterator<char>>>>>,burst::compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
           (__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
            first,__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
                  last,
           compose_fn<burst::apply_fn<std::less<void>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>
           compare)

{
  iterator_range<std::_List_const_iterator<char>_> *piVar1;
  _List_node_base *p_Var2;
  __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
  _Var3;
  bool bVar4;
  __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
  ts;
  iterator_range<std::_List_const_iterator<char>_> *ts_1;
  undefined1 local_3b [3];
  _List_node_base *local_38;
  _List_node_base *p_Stack_30;
  
  if (first._M_current != last._M_current) {
    ts._M_current = first._M_current;
    _Var3._M_current = first._M_current;
    while (ts_1 = _Var3._M_current, piVar1 = ts._M_current, ts._M_current = piVar1 + 1,
          ts._M_current != last._M_current) {
      bVar4 = compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>
              ::operator()(local_3b,ts._M_current,ts_1);
      if (bVar4) {
        local_38 = ((first._M_current)->
                   super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                   ).
                   super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                   .m_Begin._M_node;
        p_Stack_30 = ((first._M_current)->
                     super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                     ).
                     super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                     .m_End._M_node;
        p_Var2 = piVar1[1].
                 super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                 .
                 super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                 .m_End._M_node;
        ((first._M_current)->
        super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
        ).
        super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_node =
             ((ts._M_current)->
             super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
             ).
             super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin._M_node;
        ((first._M_current)->
        super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
        ).
        super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
        .m_End._M_node = p_Var2;
        ((ts._M_current)->
        super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
        ).
        super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_node = local_38;
        piVar1[1].
        super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
        .m_End._M_node = p_Stack_30;
        _Var3._M_current = first._M_current;
      }
      else {
        bVar4 = compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>
                ::operator()(local_3b,ts_1,ts._M_current);
        _Var3._M_current = ts_1;
        if ((!bVar4) && (_Var3._M_current = ts_1 + 1, piVar1 != ts_1)) {
          local_38 = ((_Var3._M_current)->
                     super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                     ).
                     super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                     .m_Begin._M_node;
          p_Stack_30 = ts_1[1].
                       super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                       .
                       super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                       .m_End._M_node;
          p_Var2 = piVar1[1].
                   super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                   .m_End._M_node;
          ((_Var3._M_current)->
          super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
          ).
          super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin._M_node =
               ((ts._M_current)->
               super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
               ).
               super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_node;
          ts_1[1].
          super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
          .m_End._M_node = p_Var2;
          ((ts._M_current)->
          super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
          ).
          super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin._M_node = local_38;
          piVar1[1].
          super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<std::_List_const_iterator<char>,_boost::iterators::incrementable_traversal_tag>
          .m_End._M_node = p_Stack_30;
        }
      }
    }
    first._M_current = ts_1 + 1;
  }
  return (__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
          )first._M_current;
}

Assistant:

auto select_min (ForwardIterator first, ForwardIterator last, BinaryPredicate compare)
    {
        if (first != last)
        {
            auto min = first;

            for (auto current = std::next(first); current != last; ++current)
            {
                if (compare(*current, *min))
                {
                    std::iter_swap(first, current);
                    min = first;
                }
                else if (not compare(*min, *current))
                {
                    ++min;
                    if (min != current)
                    {
                        std::iter_swap(min, current);
                    }
                }
            }

            return ++min;
        }

        return first;
    }